

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.c
# Opt level: O0

void thread_free(thread_handle *pt)

{
  void *pvVar1;
  thread_priv *priv;
  thread_handle *pt_local;
  
  pvVar1 = pt->priv;
  if (pt->priv != (void *)0x0) {
    thread_join(pt);
    mutex_free((mutex_handle *)((long)pvVar1 + 8));
    free(pt->priv);
    pt->priv = (void *)0x0;
  }
  return;
}

Assistant:

void thread_free(struct thread_handle *pt)
{
	struct thread_priv *priv = pt->priv;

	if (pt->priv != NULL) {
		thread_join(pt);

		mutex_free(&priv->mutex);

		free(pt->priv);
		pt->priv = NULL;
	}
}